

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var __thiscall cs::runtime_type::parse_minus(runtime_type *this,var *b)

{
  bool bVar1;
  runtime_error *this_00;
  any *in_RSI;
  proxy *in_RDI;
  string *in_stack_ffffffffffffff68;
  any *in_stack_ffffffffffffff70;
  numeric *in_stack_ffffffffffffff78;
  allocator *paVar2;
  proxy *this_01;
  numeric *in_stack_ffffffffffffff98;
  allocator local_59;
  string local_58 [72];
  
  this_01 = in_RDI;
  cs_impl::any::type(in_stack_ffffffffffffff70);
  bVar1 = std::type_info::operator==((type_info *)this_01,(type_info *)in_stack_ffffffffffffff78);
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    paVar2 = &local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"Unsupported operator operations(Minus).",paVar2);
    runtime_error::runtime_error(this_00,in_stack_ffffffffffffff68);
    __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  cs_impl::any::const_val<cs::numeric>(in_RSI);
  numeric::operator-(in_stack_ffffffffffffff98);
  cs_impl::any::any<cs::numeric>((any *)this_01,in_stack_ffffffffffffff78);
  return (var)in_RDI;
}

Assistant:

var runtime_type::parse_minus(const var &b)
	{
		if (b.type() == typeid(numeric))
			return -b.const_val<numeric>();
		else
			throw runtime_error("Unsupported operator operations(Minus).");
	}